

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O3

void ostringstream_suite::test_view(void)

{
  string input;
  ostringstream output;
  undefined1 local_1c9;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  long local_198 [2];
  long local_188 [4];
  int aiStack_168 [20];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"alpha","");
  local_1a8 = *(int *)((long)aiStack_168 + *(long *)(local_188[0] + -0x18)) == 0;
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x4d,"void ostringstream_suite::test_view()",&local_1a8,&local_1c9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,(char *)local_1c8,local_1c0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,std::__cxx11::string>
            ("output.str()","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x4f,"void ostringstream_suite::test_view()",&local_1a8,(string *)&local_1c8);
  if ((long *)CONCAT71(uStack_1a7,local_1a8) != local_198) {
    operator_delete((long *)CONCAT71(uStack_1a7,local_1a8),local_198[0] + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void test_view()
{
    std::ostringstream output;
    ostream_buffer<char> container(output);
    std::string input = "alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));
    TRIAL_PROTOCOL_TEST_EQUAL(output.str(), input);
}